

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inverse_fast_fourier_transform.cc
# Opt level: O0

bool __thiscall
sptk::InverseFastFourierTransform::Run
          (InverseFastFourierTransform *this,
          vector<double,_std::allocator<double>_> *real_part_input,
          vector<double,_std::allocator<double>_> *imag_part_input,
          vector<double,_std::allocator<double>_> *real_part_output,
          vector<double,_std::allocator<double>_> *imag_part_output)

{
  bool bVar1;
  int iVar2;
  iterator __first;
  iterator __last;
  vector<double,_std::allocator<double>_> *in_RDI;
  double z;
  int fft_length;
  vector<double,_std::allocator<double>_> *in_stack_000000a8;
  vector<double,_std::allocator<double>_> *in_stack_000000b0;
  vector<double,_std::allocator<double>_> *in_stack_000000b8;
  vector<double,_std::allocator<double>_> *in_stack_000000c0;
  FastFourierTransform *in_stack_000000c8;
  anon_class_8_1_54a3981a in_stack_ffffffffffffff60;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff68;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff70;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff78;
  
  bVar1 = FastFourierTransform::Run
                    (in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,
                     in_stack_000000a8);
  if (bVar1) {
    iVar2 = FastFourierTransform::GetFftLength
                      ((FastFourierTransform *)
                       &(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_finish);
    std::vector<double,_std::allocator<double>_>::begin(in_RDI);
    std::vector<double,_std::allocator<double>_>::begin(in_RDI);
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::operator+
              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_stack_ffffffffffffff68._M_current,(difference_type)in_stack_ffffffffffffff60.z);
    std::vector<double,_std::allocator<double>_>::begin(in_RDI);
    std::
    transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,sptk::InverseFastFourierTransform::Run(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>*,std::vector<double,std::allocator<double>>*)const::__0>
              (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
               in_stack_ffffffffffffff60);
    std::vector<double,_std::allocator<double>_>::begin(in_RDI);
    __first = std::vector<double,_std::allocator<double>_>::begin(in_RDI);
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::operator+
              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_stack_ffffffffffffff68._M_current,(difference_type)in_stack_ffffffffffffff60.z);
    __last = std::vector<double,_std::allocator<double>_>::begin(in_RDI);
    std::
    transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,sptk::InverseFastFourierTransform::Run(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>*,std::vector<double,std::allocator<double>>*)const::__1>
              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               __first._M_current,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               __last._M_current,(double *)(1.0 / (double)iVar2),in_stack_ffffffffffffff60);
  }
  return bVar1;
}

Assistant:

bool InverseFastFourierTransform::Run(
    const std::vector<double>& real_part_input,
    const std::vector<double>& imag_part_input,
    std::vector<double>* real_part_output,
    std::vector<double>* imag_part_output) const {
  if (!fast_fourier_transform_.Run(imag_part_input, real_part_input,
                                   imag_part_output, real_part_output)) {
    return false;
  }

  const int fft_length(fast_fourier_transform_.GetFftLength());
  const double z(1.0 / fft_length);
  std::transform(real_part_output->begin(),
                 real_part_output->begin() + fft_length,
                 real_part_output->begin(), [z](double x) { return x * z; });
  std::transform(imag_part_output->begin(),
                 imag_part_output->begin() + fft_length,
                 imag_part_output->begin(), [z](double x) { return x * z; });

  return true;
}